

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testC14N.c
# Opt level: O2

int test_c14n(char *xml_filename,int with_comments,int mode,char *xpath_filename,
             xmlChar **inclusive_namespaces)

{
  int iVar1;
  uint uVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ssize_t sVar9;
  undefined8 uVar10;
  char *__format;
  long *plVar11;
  xmlChar *result;
  char *local_50;
  int local_44;
  char *local_40;
  xmlChar **local_38;
  
  result = (xmlChar *)0x0;
  puVar3 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar3 = 6;
  xmlSubstituteEntitiesDefault(1);
  lVar4 = xmlReadFile(xml_filename,0,10);
  if (lVar4 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",xml_filename);
    return -1;
  }
  lVar5 = xmlDocGetRootElement(lVar4);
  if (lVar5 == 0) {
    fprintf(_stderr,"Error: empty document for file \"%s\"\n",xml_filename);
    goto LAB_001018df;
  }
  local_50 = xpath_filename;
  if (xpath_filename == (char *)0x0) {
    lVar6 = 0;
    uVar10 = 0;
    local_40 = xml_filename;
LAB_001016f9:
    uVar2 = xmlC14NDocDumpMemory(lVar4,uVar10,mode,inclusive_namespaces,with_comments,&result);
    if (-1 < (int)uVar2) {
      if (result != (xmlChar *)0x0) {
        sVar9 = write(1,result,(ulong)uVar2);
        if (sVar9 == -1) {
          fwrite("Can\'t write data\n",0x11,1,_stderr);
        }
        (*_xmlFree)(result);
      }
      if (local_50 != (char *)0x0) {
        xmlXPathFreeObject(lVar6);
      }
      xmlFreeDoc(lVar4);
      return uVar2;
    }
    fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",local_40,(ulong)uVar2
           );
    if (result != (xmlChar *)0x0) {
      (*_xmlFree)();
    }
    goto LAB_001018df;
  }
  local_44 = with_comments;
  puVar3 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar3 = 6;
  xmlSubstituteEntitiesDefault(1);
  lVar5 = xmlReadFile(xpath_filename,0,10);
  if (lVar5 != 0) {
    lVar6 = xmlDocGetRootElement(lVar5);
    if (lVar6 == 0) {
      __format = "Error: empty document for file \"%s\"\n";
    }
    else {
      plVar11 = (long *)(lVar5 + 0x18);
      local_38 = inclusive_namespaces;
      while (lVar6 = *plVar11, lVar6 != 0) {
        iVar1 = xmlStrEqual(*(undefined8 *)(lVar6 + 0x10),"XPath");
        if (iVar1 != 0) {
          local_40 = xml_filename;
          lVar7 = xmlNodeGetContent(lVar6);
          if (lVar7 == 0) {
            __format = "Error: XPath content element is NULL \"%s\"\n";
            xpath_filename = local_50;
            goto LAB_00101837;
          }
          lVar8 = xmlXPathNewContext(lVar4);
          if (lVar8 == 0) {
            fwrite("Error: unable to create new context\n",0x24,1,_stderr);
            (*_xmlFree)(lVar7);
            goto LAB_001018bb;
          }
          plVar11 = (long *)(lVar6 + 0x60);
          goto LAB_0010166a;
        }
        plVar11 = (long *)(lVar6 + 0x30);
      }
      __format = "Error: XPath element expected in the file  \"%s\"\n";
      xpath_filename = local_50;
    }
LAB_00101837:
    fprintf(_stderr,__format,xpath_filename);
    goto LAB_001018bb;
  }
  fprintf(_stderr,"Error: unable to parse file \"%s\"\n",xpath_filename);
  goto LAB_001018c3;
  while (iVar1 = xmlXPathRegisterNs(lVar8,plVar11[3],plVar11[2]), iVar1 == 0) {
LAB_0010166a:
    plVar11 = (long *)*plVar11;
    if (plVar11 == (long *)0x0) {
      lVar6 = xmlXPathEvalExpression(lVar7,lVar8);
      if (lVar6 == 0) {
        fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
        goto LAB_001018a7;
      }
      (*_xmlFree)(lVar7);
      xmlXPathFreeContext(lVar8);
      xmlFreeDoc(lVar5);
      uVar10 = *(undefined8 *)(lVar6 + 8);
      inclusive_namespaces = local_38;
      with_comments = local_44;
      goto LAB_001016f9;
    }
  }
  fprintf(_stderr,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n",plVar11[3],
          plVar11[2]);
LAB_001018a7:
  (*_xmlFree)(lVar7);
  xmlXPathFreeContext(lVar8);
LAB_001018bb:
  xmlFreeDoc(lVar5);
LAB_001018c3:
  fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
LAB_001018df:
  xmlFreeDoc(lVar4);
  return -1;
}

Assistant:

static int
test_c14n(const char* xml_filename, int with_comments, int mode,
	const char* xpath_filename, xmlChar **inclusive_namespaces) {
    xmlDocPtr doc;
    xmlXPathObjectPtr xpath = NULL;
    xmlChar *result = NULL;
    int ret;

    /*
     * build an XML tree from a the file; we need to add default
     * attributes and resolve all character and entities references
     */
    xmlLoadExtDtdDefaultValue = XML_DETECT_IDS | XML_COMPLETE_ATTRS;
    xmlSubstituteEntitiesDefault(1);

    doc = xmlReadFile(xml_filename, NULL, XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (doc == NULL) {
	fprintf(stderr, "Error: unable to parse file \"%s\"\n", xml_filename);
	return(-1);
    }

    /*
     * Check the document is of the right kind
     */
    if(xmlDocGetRootElement(doc) == NULL) {
        fprintf(stderr,"Error: empty document for file \"%s\"\n", xml_filename);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * load xpath file if specified
     */
    if(xpath_filename) {
	xpath = load_xpath_expr(doc, xpath_filename);
	if(xpath == NULL) {
	    fprintf(stderr,"Error: unable to evaluate xpath expression\n");
	    xmlFreeDoc(doc);
	    return(-1);
	}
    }

    /*
     * Canonical form
     */
    /* fprintf(stderr,"File \"%s\" loaded: start canonization\n", xml_filename); */
    ret = xmlC14NDocDumpMemory(doc,
	    (xpath) ? xpath->nodesetval : NULL,
	    mode, inclusive_namespaces,
	    with_comments, &result);
    if(ret >= 0) {
	if(result != NULL) {
	    if (write(STDOUT_FILENO, result, ret) == -1) {
		fprintf(stderr, "Can't write data\n");
	    }
	    xmlFree(result);
	}
    } else {
	fprintf(stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n", xml_filename, ret);
	if(result != NULL) xmlFree(result);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * Cleanup
     */
    if(xpath != NULL) xmlXPathFreeObject(xpath);
    xmlFreeDoc(doc);

    return(ret);
}